

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactSurfaceMesh::SurfaceSyncCollisionModels(ChContactSurfaceMesh *this)

{
  bool bVar1;
  pointer psVar2;
  pointer psVar3;
  ulong uVar4;
  ulong uVar5;
  
  psVar2 = (this->vfaces).
           super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vfaces).
      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      (*(psVar2[uVar4].
         super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        collision_model->_vptr_ChCollisionModel[0x18])();
      psVar2 = (this->vfaces).
               super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar5 < (ulong)((long)(this->vfaces).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  psVar3 = (this->vfaces_rot).
           super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vfaces_rot).
      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      (*(psVar3[uVar4].
         super___shared_ptr<chrono::fea::ChContactTriangleXYZROT,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->collision_model->_vptr_ChCollisionModel[0x18])();
      psVar3 = (this->vfaces_rot).
               super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar5 < (ulong)((long)(this->vfaces_rot).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

void ChContactSurfaceMesh::SurfaceSyncCollisionModels() {
    for (unsigned int j = 0; j < vfaces.size(); j++) {
        vfaces[j]->GetCollisionModel()->SyncPosition();
    }
    for (unsigned int j = 0; j < vfaces_rot.size(); j++) {
        vfaces_rot[j]->GetCollisionModel()->SyncPosition();
    }
}